

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::PushColumnsBackground(void)

{
  ImVec4 *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiOldColumns *pIVar3;
  ImDrawList *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  if (pIVar3->Count == 1) {
    return;
  }
  IVar5 = (pIVar2->ClipRect).Max;
  (pIVar3->HostBackupClipRect).Min = (pIVar2->ClipRect).Min;
  (pIVar3->HostBackupClipRect).Max = IVar5;
  IVar5 = (pIVar3->HostInitialClipRect).Max;
  IVar6 = (pIVar3->HostInitialClipRect).Min;
  IVar7 = (pIVar3->HostInitialClipRect).Max;
  (pIVar2->ClipRect).Min = (pIVar3->HostInitialClipRect).Min;
  (pIVar2->ClipRect).Max = IVar5;
  pIVar4 = pIVar2->DrawList;
  (pIVar4->_CmdHeader).ClipRect.x = IVar6.x;
  (pIVar4->_CmdHeader).ClipRect.y = IVar6.y;
  (pIVar4->_CmdHeader).ClipRect.z = IVar7.x;
  (pIVar4->_CmdHeader).ClipRect.w = IVar7.y;
  pIVar1 = (pIVar2->DrawList->_ClipRectStack).Data +
           (long)(pIVar2->DrawList->_ClipRectStack).Size + -1;
  pIVar1->x = IVar6.x;
  pIVar1->y = IVar6.y;
  pIVar1->z = IVar7.x;
  pIVar1->w = IVar7.y;
  ImDrawListSplitter::SetCurrentChannel(&pIVar3->Splitter,pIVar2->DrawList,0);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }